

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O2

void __thiscall
Js::InterpreterHaltState::InterpreterHaltState
          (InterpreterHaltState *this,StopType _stopType,FunctionBody *_executingFunction,
          MutationBreakpoint *_activeMutationBP)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  this->stopType = _stopType;
  this->executingFunction = _executingFunction;
  this->stringBuilder = (StringBuilder<Memory::ArenaAllocator> *)0x0;
  this->topFrame = (DiagStackFrame *)0x0;
  this->framePointers = (DiagStack *)0x0;
  this->referencedDiagnosticArena = (ReferencedArenaAdapter *)0x0;
  this->exceptionObject = (JavascriptExceptionObject *)0x0;
  this->activeMutationBP = _activeMutationBP;
  if ((_executingFunction == (FunctionBody *)0x0) &&
     ((STOP_DOMMUTATIONBREAKPOINT < _stopType || ((0x68U >> (_stopType & 0x1f) & 1) == 0)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagProbe.cpp"
                                ,0x19,
                                "(executingFunction || (stopType == STOP_EXCEPTIONTHROW || stopType == STOP_MUTATIONBREAKPOINT || stopType == STOP_DOMMUTATIONBREAKPOINT))"
                                ,
                                "executingFunction || (stopType == STOP_EXCEPTIONTHROW || stopType == STOP_MUTATIONBREAKPOINT || stopType == STOP_DOMMUTATIONBREAKPOINT)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

InterpreterHaltState::InterpreterHaltState(StopType _stopType, const FunctionBody* _executingFunction, MutationBreakpoint* _activeMutationBP/*= nullptr*/) :
        stopType(_stopType),
        executingFunction(_executingFunction),
        topFrame(nullptr),
        framePointers(nullptr),
        referencedDiagnosticArena(nullptr),
        exceptionObject(nullptr),
        stringBuilder(nullptr),
        activeMutationBP(_activeMutationBP)
    {
        Assert(executingFunction || (stopType == STOP_EXCEPTIONTHROW || stopType == STOP_MUTATIONBREAKPOINT || stopType == STOP_DOMMUTATIONBREAKPOINT));
    }